

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O0

AssertionResult * __thiscall
iutest::internal::CmpHelperEQ<char[1],iutest::detail::iuFilePath>
          (AssertionResult *__return_storage_ptr__,internal *this,char *expected_str,
          char *actual_str,char (*expected) [1],iuFilePath *actual)

{
  char (*actual_expression) [1];
  char *expected_expression;
  bool bVar1;
  string local_70;
  string local_50;
  internal *local_30;
  iuFilePath *actual_local;
  char (*expected_local) [1];
  char *actual_str_local;
  char *expected_str_local;
  
  local_30 = (internal *)expected;
  actual_local = (iuFilePath *)actual_str;
  expected_local = (char (*) [1])expected_str;
  actual_str_local = (char *)this;
  expected_str_local = (char *)__return_storage_ptr__;
  bVar1 = iuOperatorEQ<iutest::detail::iuFilePath,char[1]>
                    ((iuFilePath *)expected,(char (*) [1])actual_str);
  expected_expression = actual_str_local;
  actual_expression = expected_local;
  if (bVar1) {
    AssertionSuccess();
  }
  else {
    FormatForComparisonFailureMessage<char[1],iutest::detail::iuFilePath>
              (&local_50,(internal *)actual_local,(char (*) [1])local_30,(iuFilePath *)actual_str);
    FormatForComparisonFailureMessage<iutest::detail::iuFilePath,char[1]>
              (&local_70,local_30,actual_local,(char (*) [1])actual_str);
    EqFailure(__return_storage_ptr__,expected_expression,*actual_expression,&local_50,&local_70,
              false);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

IUTEST_COND_LIKELY( iuOperatorEQ(actual, expected) )
    {
        return AssertionSuccess();
    }